

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::enumeratePhysicalDevices
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log;
  long lVar1;
  Context *pCVar2;
  TestStatus *pTVar3;
  qpTestResult qVar4;
  InstanceInterface *vk;
  VkInstance instance;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> outputData;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  size_type __dnew;
  ResultCollector results;
  string local_290;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_270;
  string local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  string local_230;
  Context *local_210;
  TestStatus *local_208;
  ResultCollector local_200;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  qpKeyValueTag local_150;
  deInt64 local_148;
  ios_base local_138 [264];
  
  log = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)context->m_testCtx->m_log;
  local_1b0._0_8_ = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"");
  tcu::ResultCollector::ResultCollector
            (&local_200,(TestLog *)&log->_M_allocated_capacity,(string *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
  }
  vk = Context::getInstanceInterface(context);
  instance = Context::getInstance(context);
  ::vk::enumeratePhysicalDevices(&local_270,vk,instance);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"NumDevices","");
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_238 = log;
  local_210 = context;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Number of devices","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)local_1b0,&local_290,&local_258,&local_230,QP_KEY_TAG_NONE,
             (long)local_270.
                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_270.
                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  tcu::TestLog::writeInteger
            ((TestLog *)&local_238->_M_allocated_capacity,(char *)local_1b0._0_8_,local_190._M_p,
             local_170._M_p,local_150,local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != &local_160) {
    operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != &local_180) {
    operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  local_208 = __return_storage_ptr__;
  if (local_270.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_270.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
  }
  else {
    this = (ostringstream *)(local_1b0 + 8);
    uVar7 = 0;
    do {
      local_1b0._0_8_ = local_238;
      std::__cxx11::ostringstream::ostringstream(this);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
      std::ostream::_M_insert<void_const*>(this);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base(local_138);
      uVar7 = uVar7 + 1;
      uVar6 = (long)local_270.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_270.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
    } while (uVar7 < uVar6);
  }
  pTVar3 = local_208;
  local_258._M_string_length = 0;
  local_258._M_dataplus._M_p = (pointer)&PTR__CheckIncompleteResult_00d53bc0;
  if (local_270.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_270.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) goto LAB_004435a8;
  std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::vector
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &local_290,uVar6,(allocator_type *)local_1b0);
  pCVar2 = local_210;
  if (local_290._M_dataplus._M_p < local_290._M_string_length) {
    pcVar5 = local_290._M_dataplus._M_p + 8;
    if (local_290._M_dataplus._M_p + 8 < local_290._M_string_length) {
      pcVar5 = (char *)local_290._M_string_length;
    }
    memset(local_290._M_dataplus._M_p,0xde,
           ((ulong)(pcVar5 + ~(ulong)local_290._M_dataplus._M_p) & 0xfffffffffffffff8) + 8);
  }
  local_258._M_string_length = uVar6 / 3 & 0xffffffff;
  (**(code **)(local_258._M_dataplus._M_p + 0x10))(&local_258,pCVar2,local_290._M_dataplus._M_p);
  if (((int)local_258._M_string_length == (int)(uVar6 / 3)) &&
     (local_258._M_string_length._4_4_ == 5)) {
    for (pcVar5 = local_290._M_dataplus._M_p + (local_258._M_string_length & 0xffffffff) * 8;
        (pcVar5 < local_290._M_string_length && (*pcVar5 == -0x22)); pcVar5 = pcVar5 + 8) {
      uVar6 = 0xffffffffffffffff;
      do {
        if (uVar6 == 6) goto LAB_00443509;
        uVar7 = uVar6 + 1;
        lVar1 = uVar6 + 2;
        uVar6 = uVar7;
      } while (pcVar5[lVar1] == -0x22);
      if (uVar7 < 7) break;
LAB_00443509:
    }
    if (pcVar5 < local_290._M_string_length) goto LAB_00443514;
  }
  else {
LAB_00443514:
    local_230._M_dataplus._M_p = (pointer)0x21;
    local_1b0._0_8_ = &local_1a0;
    local_1b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_230);
    local_1a0._M_allocated_capacity = (size_type)local_230._M_dataplus._M_p;
    *(undefined8 *)(local_1b0._0_8_ + 0x10) = 0x495f4b56206e7275;
    *(undefined8 *)(local_1b0._0_8_ + 0x18) = 0x54454c504d4f434e;
    *(undefined8 *)local_1b0._0_8_ = 0x6964207972657551;
    *(undefined8 *)(local_1b0._0_8_ + 8) = 0x7465722074276e64;
    *(char *)(local_1b0._0_8_ + 0x20) = 'E';
    local_1b0._8_8_ = local_230._M_dataplus._M_p;
    local_230._M_dataplus._M_p[local_1b0._0_8_] = '\0';
    tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_290._M_dataplus._M_p,
                    local_290.field_2._M_allocated_capacity - (long)local_290._M_dataplus._M_p);
  }
LAB_004435a8:
  qVar4 = tcu::ResultCollector::getResult(&local_200);
  local_1b0._0_8_ = &local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,local_200.m_message._M_dataplus._M_p,
             local_200.m_message._M_dataplus._M_p + local_200.m_message._M_string_length);
  pTVar3->m_code = qVar4;
  (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar3->m_description,local_1b0._0_8_,
             (char *)(local_1b0._0_8_ + local_1b0._8_8_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
  }
  if (local_270.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_270.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_prefix._M_dataplus._M_p != &local_200.m_prefix.field_2) {
    operator_delete(local_200.m_prefix._M_dataplus._M_p,
                    local_200.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus enumeratePhysicalDevices (Context& context)
{
	TestLog&						log		= context.getTestContext().getLog();
	tcu::ResultCollector			results	(log);
	const vector<VkPhysicalDevice>	devices	= enumeratePhysicalDevices(context.getInstanceInterface(), context.getInstance());

	log << TestLog::Integer("NumDevices", "Number of devices", "", QP_KEY_TAG_NONE, deInt64(devices.size()));

	for (size_t ndx = 0; ndx < devices.size(); ndx++)
		log << TestLog::Message << ndx << ": " << devices[ndx] << TestLog::EndMessage;

	CheckEnumeratePhysicalDevicesIncompleteResult()(context, results, devices.size());

	return tcu::TestStatus(results.getResult(), results.getMessage());
}